

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_unsignedShort(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data actValue_01;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  byte bVar1;
  bool bVar2;
  XMLCh *pXVar3;
  char *pcVar4;
  XSValue *pXVar5;
  char *pcVar6;
  char *pcVar7;
  wchar16 *pwVar8;
  long lVar9;
  void *pvVar10;
  bool bVar11;
  StrX local_7a0;
  StrX local_790;
  char *local_780;
  char *actRetCanRep_inchar_5;
  wchar16 *local_768;
  XMLCh *actRetCanRep_9;
  undefined1 local_758 [4];
  Status myStatus_23;
  StrX local_748;
  char *local_738;
  char *actRetCanRep_inchar_4;
  wchar16 *local_720;
  XMLCh *actRetCanRep_8;
  undefined1 local_710 [4];
  Status myStatus_22;
  StrX local_700;
  StrX local_6f0;
  long local_6e0;
  XMLCh *actRetCanRep_7;
  undefined1 local_6d0 [4];
  Status myStatus_21;
  StrX local_6c0;
  StrX local_6b0;
  long local_6a0;
  XMLCh *actRetCanRep_6;
  undefined1 local_690 [4];
  Status myStatus_20;
  StrX local_680;
  StrX local_670;
  long local_660;
  XMLCh *actRetCanRep_5;
  undefined1 local_650 [4];
  Status myStatus_19;
  StrX local_640;
  StrX local_630;
  long local_620;
  XMLCh *actRetCanRep_4;
  undefined1 local_610 [4];
  Status myStatus_18;
  StrX local_600;
  char *local_5f0;
  char *actRetCanRep_inchar_3;
  wchar16 *local_5d8;
  XMLCh *actRetCanRep_3;
  undefined1 local_5c8 [4];
  Status myStatus_17;
  StrX local_5b8;
  char *local_5a8;
  char *actRetCanRep_inchar_2;
  wchar16 *local_590;
  XMLCh *actRetCanRep_2;
  undefined1 local_580 [4];
  Status myStatus_16;
  StrX local_570;
  char *local_560;
  char *actRetCanRep_inchar_1;
  wchar16 *local_548;
  XMLCh *actRetCanRep_1;
  undefined1 local_538 [4];
  Status myStatus_15;
  StrX local_528;
  char *local_518;
  char *actRetCanRep_inchar;
  wchar16 *local_500;
  XMLCh *actRetCanRep;
  Status myStatus_14;
  int j;
  StrX local_4e0;
  StrX local_4d0;
  XSValue *local_4c0;
  XSValue *actRetValue_6;
  undefined1 local_4b0 [4];
  Status myStatus_13;
  StrX local_4a0;
  StrX local_490;
  XSValue *local_480;
  XSValue *actRetValue_5;
  undefined1 local_470 [4];
  Status myStatus_12;
  StrX local_460;
  StrX local_450;
  XSValue *local_440;
  XSValue *actRetValue_4;
  undefined1 local_430 [4];
  Status myStatus_11;
  StrX local_420;
  StrX local_410;
  XSValue *local_400;
  XSValue *actRetValue_3;
  undefined1 local_3f0 [4];
  Status myStatus_10;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  StrX local_390;
  XSValue *local_380;
  XSValue *actRetValue_2;
  undefined1 local_370 [4];
  Status myStatus_9;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  StrX local_310;
  XSValue *local_300;
  XSValue *actRetValue_1;
  undefined1 local_2f0 [4];
  Status myStatus_8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  StrX local_290;
  XSValue *local_280;
  XSValue *actRetValue;
  Status myStatus_7;
  int i;
  StrX local_260;
  StrX local_250;
  byte local_23d;
  Status local_23c;
  undefined1 local_238 [3];
  bool actRetValid_6;
  Status myStatus_6;
  StrX local_228;
  StrX local_218;
  byte local_205;
  Status local_204;
  undefined1 local_200 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_1f0;
  StrX local_1e0;
  byte local_1cd;
  Status local_1cc;
  undefined1 local_1c8 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_1b8;
  StrX local_1a8;
  byte local_195;
  Status local_194;
  undefined1 local_190 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_180;
  byte local_16d;
  Status local_16c;
  undefined1 local_168 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_158;
  byte local_145;
  Status local_144;
  undefined1 local_140 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_120;
  byte local_10d;
  Status local_10c;
  char acStack_108 [3];
  bool actRetValid;
  Status myStatus;
  char data_canrep_2 [6];
  char data_rawstr_2 [9];
  char data_canrep_1 [6];
  char data_rawstr_1 [15];
  char lex_iv_2 [8];
  char lex_iv_1 [10];
  char lex_v_ran_iv_2_canrep [3];
  char lex_v_ran_iv_1_canrep [6];
  char lex_v_ran_v_2_canrep [2];
  char lex_v_ran_v_1_canrep [6];
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  XSValue_Data act_v_ran_v_0;
  char lex_v_ran_iv_2 [3];
  char lex_v_ran_iv_1 [7];
  char lex_v_ran_v_2 [2];
  char lex_v_ran_v_1 [7];
  char lex_v_ran_v_0 [12];
  bool toValidate;
  DataType dt;
  
  _lex_v_ran_v_1 = 0x3433323120202020;
  stack0xffffffffffffffd8 = 0x3535362b;
  lex_v_ran_iv_1[2] = '0';
  lex_v_ran_iv_1[3] = '\0';
  act_v_ran_v_0.fValue._28_4_ = 0x3535362b;
  act_v_ran_v_0.fValue._26_1_ = 0;
  act_v_ran_v_0.fValue._24_2_ = 0x312d;
  act_v_ran_v_0.f_datatype._0_2_ = 0x4d2;
  act_v_ran_v_1.f_datatype._0_2_ = 0xffff;
  act_v_ran_v_2.f_datatype._0_2_ = dt_string;
  builtin_strncpy(lex_v_ran_iv_1_canrep,"65535",6);
  stack0xffffffffffffff46 = 0x30;
  lex_v_ran_iv_2_canrep[0] = '6';
  lex_v_ran_iv_2_canrep[1] = '\0';
  stack0xffffffffffffff40 = 0x33353536;
  lex_iv_1[6] = '\0';
  lex_iv_1[4] = '-';
  lex_iv_1[5] = '1';
  builtin_strncpy(lex_iv_2,"12b34.45",8);
  lex_iv_1[0] = '6';
  lex_iv_1[1] = '\0';
  stack0xffffffffffffff28 = 0x36356234333231;
  data_rawstr_1[0] = '4';
  data_rawstr_1[1] = '5';
  data_rawstr_1[2] = ' ';
  data_rawstr_1[3] = ' ';
  data_rawstr_1[4] = ' ';
  data_rawstr_1[5] = '\n';
  data_rawstr_1[6] = '\0';
  _data_canrep_1 = 0x32312b20202020;
  stack0xffffffffffffff10 = 0x34333231;
  _data_canrep_2 = 0x3534333231303030;
  data_rawstr_2[0] = '\0';
  myStatus._0_2_ = 0x35;
  _acStack_108 = 0x34333231;
  local_10c = st_Init;
  StrX::StrX(&local_120,lex_v_ran_v_1);
  pXVar3 = StrX::unicodeForm(&local_120);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedShort,&local_10c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_120);
  local_10d = bVar1 & 1;
  if (local_10d != 1) {
    pXVar3 = getDataTypeString(dt_unsignedShort);
    StrX::StrX((StrX *)local_140,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_140);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb09,lex_v_ran_v_1,pcVar4,1);
    StrX::~StrX((StrX *)local_140);
    errSeen = true;
  }
  local_144 = st_Init;
  StrX::StrX(&local_158,lex_v_ran_iv_1 + 4);
  pXVar3 = StrX::unicodeForm(&local_158);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedShort,&local_144,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_158);
  local_145 = bVar1 & 1;
  if (local_145 != 1) {
    pXVar3 = getDataTypeString(dt_unsignedShort);
    StrX::StrX((StrX *)local_168,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_168);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb0a,lex_v_ran_iv_1 + 4,pcVar4,1);
    StrX::~StrX((StrX *)local_168);
    errSeen = true;
  }
  local_16c = st_Init;
  StrX::StrX(&local_180,lex_v_ran_iv_1 + 2);
  pXVar3 = StrX::unicodeForm(&local_180);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedShort,&local_16c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_180);
  local_16d = bVar1 & 1;
  if (local_16d != 1) {
    pXVar3 = getDataTypeString(dt_unsignedShort);
    StrX::StrX((StrX *)local_190,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_190);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb0b,lex_v_ran_iv_1 + 2,pcVar4,1);
    StrX::~StrX((StrX *)local_190);
    errSeen = true;
  }
  local_194 = st_Init;
  StrX::StrX(&local_1a8,(char *)((long)&act_v_ran_v_0.fValue + 0x1c));
  pXVar3 = StrX::unicodeForm(&local_1a8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedShort,&local_194,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1a8);
  local_195 = bVar1 & 1;
  if (local_195 == 0) {
    if (local_194 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX((StrX *)local_1c8,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_1c8);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_194);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xb0e,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_1c8);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedShort);
    StrX::StrX(&local_1b8,pXVar3);
    pcVar4 = StrX::localForm(&local_1b8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb0e,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4,0);
    StrX::~StrX(&local_1b8);
    errSeen = true;
  }
  local_1cc = st_Init;
  StrX::StrX(&local_1e0,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_1e0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedShort,&local_1cc,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1e0);
  local_1cd = bVar1 & 1;
  if (local_1cd == 0) {
    if (local_1cc != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX((StrX *)local_200,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_200);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_1cc);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xb0f,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_200);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedShort);
    StrX::StrX(&local_1f0,pXVar3);
    pcVar4 = StrX::localForm(&local_1f0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb0f,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,0);
    StrX::~StrX(&local_1f0);
    errSeen = true;
  }
  local_204 = st_Init;
  StrX::StrX(&local_218,lex_iv_2);
  pXVar3 = StrX::unicodeForm(&local_218);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedShort,&local_204,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_218);
  local_205 = bVar1 & 1;
  if (local_205 == 0) {
    if (local_204 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX((StrX *)local_238,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_238);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_204);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xb12,lex_iv_2,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_238);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedShort);
    StrX::StrX(&local_228,pXVar3);
    pcVar4 = StrX::localForm(&local_228);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb12,lex_iv_2,pcVar4,0);
    StrX::~StrX(&local_228);
    errSeen = true;
  }
  local_23c = st_Init;
  StrX::StrX(&local_250,data_rawstr_1 + 8);
  pXVar3 = StrX::unicodeForm(&local_250);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedShort,&local_23c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_250);
  local_23d = bVar1 & 1;
  if (local_23d == 0) {
    if (local_23c != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX((StrX *)&myStatus_7,pXVar3);
      pcVar4 = StrX::localForm((StrX *)&myStatus_7);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_23c);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xb13,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)&myStatus_7);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedShort);
    StrX::StrX(&local_260,pXVar3);
    pcVar4 = StrX::localForm(&local_260);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb13,data_rawstr_1 + 8,pcVar4,0);
    StrX::~StrX(&local_260);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_290,lex_v_ran_v_1);
    pXVar3 = StrX::unicodeForm(&local_290);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedShort,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_290);
    local_280 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX((StrX *)local_2f0,pXVar3);
      StrX::localForm((StrX *)local_2f0);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb30,lex_v_ran_v_1);
      StrX::~StrX((StrX *)local_2f0);
      errSeen = true;
    }
    else {
      memcpy(&local_2b8,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_1.fValue + 0x18);
      memcpy(&local_2e0,pvVar10,0x28);
      actValue.fValue.f_long = uStack_2b0;
      actValue._0_8_ = local_2b8;
      actValue.fValue._8_8_ = local_2a8;
      actValue.fValue._16_8_ = uStack_2a0;
      actValue.fValue.f_datetime.f_milisec = (double)local_298;
      expValue.fValue.f_long = uStack_2d8;
      expValue._0_8_ = local_2e0;
      expValue.fValue._8_8_ = local_2d0;
      expValue.fValue._16_8_ = uStack_2c8;
      expValue.fValue.f_datetime.f_milisec = (double)local_2c0;
      bVar2 = compareActualValue(dt_unsignedShort,actValue,expValue);
      pXVar5 = local_280;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_280 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_280);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_310,lex_v_ran_iv_1 + 4);
    pXVar3 = StrX::unicodeForm(&local_310);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedShort,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_310);
    local_300 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX((StrX *)local_370,pXVar3);
      StrX::localForm((StrX *)local_370);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb32,lex_v_ran_iv_1 + 4);
      StrX::~StrX((StrX *)local_370);
      errSeen = true;
    }
    else {
      memcpy(&local_338,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_2.fValue + 0x18);
      memcpy(&local_360,pvVar10,0x28);
      actValue_00.fValue.f_long = uStack_330;
      actValue_00._0_8_ = local_338;
      actValue_00.fValue._8_8_ = local_328;
      actValue_00.fValue._16_8_ = uStack_320;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_318;
      expValue_00.fValue.f_long = uStack_358;
      expValue_00._0_8_ = local_360;
      expValue_00.fValue._8_8_ = local_350;
      expValue_00.fValue._16_8_ = uStack_348;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_340;
      bVar2 = compareActualValue(dt_unsignedShort,actValue_00,expValue_00);
      pXVar5 = local_300;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_300 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_300);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_2._4_4_ = 0;
    StrX::StrX(&local_390,lex_v_ran_iv_1 + 2);
    pXVar3 = StrX::unicodeForm(&local_390);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedShort,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_390);
    local_380 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX((StrX *)local_3f0,pXVar3);
      StrX::localForm((StrX *)local_3f0);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb33,lex_v_ran_iv_1 + 2);
      StrX::~StrX((StrX *)local_3f0);
      errSeen = true;
    }
    else {
      memcpy(&local_3b8,pXVar5,0x28);
      pcVar4 = lex_v_ran_v_1_canrep;
      memcpy(&local_3e0,pcVar4,0x28);
      actValue_01.fValue.f_long = uStack_3b0;
      actValue_01._0_8_ = local_3b8;
      actValue_01.fValue._8_8_ = local_3a8;
      actValue_01.fValue._16_8_ = uStack_3a0;
      actValue_01.fValue.f_datetime.f_milisec = (double)local_398;
      expValue_01.fValue.f_long = uStack_3d8;
      expValue_01._0_8_ = local_3e0;
      expValue_01.fValue._8_8_ = local_3d0;
      expValue_01.fValue._16_8_ = uStack_3c8;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_3c0;
      bVar2 = compareActualValue(dt_unsignedShort,actValue_01,expValue_01);
      pXVar5 = local_380;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_380 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_380);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pcVar4);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_410,(char *)((long)&act_v_ran_v_0.fValue + 0x1c));
    pXVar3 = StrX::unicodeForm(&local_410);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedShort,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_410);
    local_400 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_3._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedShort);
        StrX::StrX((StrX *)local_430,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_430);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_3._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xb34,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_430);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX(&local_420,pXVar3);
      StrX::localForm(&local_420);
      pvVar10 = (void *)0xb34;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb34,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c));
      StrX::~StrX(&local_420);
      pXVar5 = local_400;
      errSeen = true;
      if (local_400 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_400);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_450,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_450);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedShort,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_450);
    local_440 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedShort);
        StrX::StrX((StrX *)local_470,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_470);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_4._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xb35,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_470);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX(&local_460,pXVar3);
      StrX::localForm(&local_460);
      pvVar10 = (void *)0xb35;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb35,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18));
      StrX::~StrX(&local_460);
      pXVar5 = local_440;
      errSeen = true;
      if (local_440 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_440);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_490,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_490);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedShort,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_490);
    local_480 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedShort);
        StrX::StrX((StrX *)local_4b0,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_4b0);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_5._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xb37,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_4b0);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX(&local_4a0,pXVar3);
      StrX::localForm(&local_4a0);
      pvVar10 = (void *)0xb37;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb37,lex_iv_2);
      StrX::~StrX(&local_4a0);
      pXVar5 = local_480;
      errSeen = true;
      if (local_480 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_480);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_6._4_4_ = st_Init;
    StrX::StrX(&local_4d0,data_rawstr_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_4d0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedShort,(Status *)((long)&actRetValue_6 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4d0);
    local_4c0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_6._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedShort);
        StrX::StrX((StrX *)&myStatus_14,pXVar3);
        pcVar4 = StrX::localForm((StrX *)&myStatus_14);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_6._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xb38,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)&myStatus_14);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX(&local_4e0,pXVar3);
      StrX::localForm(&local_4e0);
      pvVar10 = (void *)0xb38;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb38,data_rawstr_1 + 8);
      StrX::~StrX(&local_4e0);
      pXVar5 = local_4c0;
      errSeen = true;
      if (local_4c0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_4c0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar,data_canrep_1);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_unsignedShort,(Status *)&actRetCanRep,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar);
    local_500 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX((StrX *)local_538,pXVar3);
      StrX::localForm((StrX *)local_538);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb56,data_canrep_1);
      StrX::~StrX((StrX *)local_538);
      errSeen = true;
    }
    else {
      local_518 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_518,data_rawstr_2 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_unsignedShort);
        StrX::StrX(&local_528,pXVar3);
        pcVar4 = StrX::localForm(&local_528);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xb56,data_canrep_1,pcVar4,local_518,data_rawstr_2 + 8);
        StrX::~StrX(&local_528);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_500);
      xercesc_4_0::XMLString::release(&local_518,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_1._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_1,data_canrep_2);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_1);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_unsignedShort,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_1);
    local_548 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX((StrX *)local_580,pXVar3);
      StrX::localForm((StrX *)local_580);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb57,data_canrep_2);
      StrX::~StrX((StrX *)local_580);
      errSeen = true;
    }
    else {
      local_560 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_560,acStack_108);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_unsignedShort);
        StrX::StrX(&local_570,pXVar3);
        pcVar4 = StrX::localForm(&local_570);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xb57,data_canrep_2,pcVar4,local_560,acStack_108);
        StrX::~StrX(&local_570);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_548);
      xercesc_4_0::XMLString::release(&local_560,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_2._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_2,lex_v_ran_iv_1 + 4);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_2);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_unsignedShort,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_2);
    local_590 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX((StrX *)local_5c8,pXVar3);
      StrX::localForm((StrX *)local_5c8);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb59,lex_v_ran_iv_1 + 4);
      StrX::~StrX((StrX *)local_5c8);
      errSeen = true;
    }
    else {
      local_5a8 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_5a8,lex_v_ran_iv_1_canrep);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_unsignedShort);
        StrX::StrX(&local_5b8,pXVar3);
        pcVar4 = StrX::localForm(&local_5b8);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xb59,lex_v_ran_iv_1 + 4,pcVar4,local_5a8,lex_v_ran_iv_1_canrep);
        StrX::~StrX(&local_5b8);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_590);
      xercesc_4_0::XMLString::release(&local_5a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_3._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_3,lex_v_ran_iv_1 + 2);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_3);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_unsignedShort,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_3);
    local_5d8 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX((StrX *)local_610,pXVar3);
      StrX::localForm((StrX *)local_610);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb5a,lex_v_ran_iv_1 + 2);
      StrX::~StrX((StrX *)local_610);
      errSeen = true;
    }
    else {
      local_5f0 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_5f0,lex_v_ran_iv_2_canrep + 2);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_unsignedShort);
        StrX::StrX(&local_600,pXVar3);
        pcVar4 = StrX::localForm(&local_600);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xb5a,lex_v_ran_iv_1 + 2,pcVar4,local_5f0,lex_v_ran_iv_2_canrep + 2);
        StrX::~StrX(&local_600);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_5d8);
      xercesc_4_0::XMLString::release(&local_5f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_4._4_4_ = st_Init;
    StrX::StrX(&local_630,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_630);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_unsignedShort,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_630);
    local_620 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedShort);
        StrX::StrX((StrX *)local_650,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_650);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_4._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xb5c,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_650);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX(&local_640,pXVar3);
      StrX::localForm(&local_640);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb5c,lex_iv_2);
      StrX::~StrX(&local_640);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_620);
      errSeen = true;
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_670,data_rawstr_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_670);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_unsignedShort,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_670);
    local_660 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedShort);
        StrX::StrX((StrX *)local_690,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_690);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xb5d,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_690);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX(&local_680,pXVar3);
      StrX::localForm(&local_680);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xb5d,data_rawstr_1 + 8);
      StrX::~StrX(&local_680);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_660);
      errSeen = true;
    }
  }
  actRetCanRep_6._4_4_ = st_Init;
  StrX::StrX(&local_6b0,(char *)((long)&act_v_ran_v_0.fValue + 0x1c));
  pXVar3 = StrX::unicodeForm(&local_6b0);
  lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (pXVar3,dt_unsignedShort,(Status *)((long)&actRetCanRep_6 + 4),ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_6b0);
  local_6a0 = lVar9;
  if (lVar9 == 0) {
    if (actRetCanRep_6._4_4_ != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX((StrX *)local_6d0,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_6d0);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(actRetCanRep_6._4_4_);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xb62,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_6d0);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedShort);
    StrX::StrX(&local_6c0,pXVar3);
    StrX::localForm(&local_6c0);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xb62,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c));
    StrX::~StrX(&local_6c0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_6a0);
    errSeen = true;
  }
  actRetCanRep_7._4_4_ = st_Init;
  StrX::StrX(&local_6f0,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_6f0);
  lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (pXVar3,dt_unsignedShort,(Status *)((long)&actRetCanRep_7 + 4),ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_6f0);
  local_6e0 = lVar9;
  if (lVar9 == 0) {
    if (actRetCanRep_7._4_4_ != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX((StrX *)local_710,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_710);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(actRetCanRep_7._4_4_);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xb63,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_710);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedShort);
    StrX::StrX(&local_700,pXVar3);
    pcVar4 = StrX::localForm(&local_700);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xb63,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4);
    StrX::~StrX(&local_700);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_6e0);
    errSeen = true;
  }
  actRetCanRep_8._4_4_ = 0;
  StrX::StrX((StrX *)&actRetCanRep_inchar_4,(char *)((long)&act_v_ran_v_0.fValue + 0x1c));
  pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_4);
  pwVar8 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (pXVar3,dt_unsignedShort,(Status *)((long)&actRetCanRep_8 + 4),ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX((StrX *)&actRetCanRep_inchar_4);
  local_720 = pwVar8;
  if (pwVar8 == (wchar16 *)0x0) {
    pXVar3 = getDataTypeString(dt_unsignedShort);
    StrX::StrX((StrX *)local_758,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_758);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xb66,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4);
    StrX::~StrX((StrX *)local_758);
    errSeen = true;
  }
  else {
    local_738 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar11 = xercesc_4_0::XMLString::equals(local_738,lex_iv_1 + 8);
    if (!bVar11) {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX(&local_748,pXVar3);
      pcVar4 = StrX::localForm(&local_748);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xb66,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4,local_738,lex_iv_1 + 8
            );
      StrX::~StrX(&local_748);
      errSeen = true;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_720);
    xercesc_4_0::XMLString::release(&local_738,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  actRetCanRep_9._4_4_ = 0;
  StrX::StrX((StrX *)&actRetCanRep_inchar_5,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
  pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_5);
  pwVar8 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (pXVar3,dt_unsignedShort,(Status *)((long)&actRetCanRep_9 + 4),ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX((StrX *)&actRetCanRep_inchar_5);
  local_768 = pwVar8;
  if (pwVar8 == (wchar16 *)0x0) {
    pXVar3 = getDataTypeString(dt_unsignedShort);
    StrX::StrX(&local_7a0,pXVar3);
    pcVar4 = StrX::localForm(&local_7a0);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xb67,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4);
    StrX::~StrX(&local_7a0);
    errSeen = true;
  }
  else {
    local_780 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar11 = xercesc_4_0::XMLString::equals(local_780,lex_iv_1 + 4);
    if (!bVar11) {
      pXVar3 = getDataTypeString(dt_unsignedShort);
      StrX::StrX(&local_790,pXVar3);
      pcVar4 = StrX::localForm(&local_790);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xb67,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,local_780,lex_iv_1 + 4
            );
      StrX::~StrX(&local_790);
      errSeen = true;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_768);
    xercesc_4_0::XMLString::release(&local_780,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  return;
}

Assistant:

void test_dt_unsignedShort()
{
    const XSValue::DataType dt = XSValue::dt_unsignedShort;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="    1234  \n";

    const char lex_v_ran_v_1[]="+65535";
    const char lex_v_ran_v_2[]="0";
    const char lex_v_ran_iv_1[]="+65536";
    const char lex_v_ran_iv_2[]="-1";

    XSValue::XSValue_Data act_v_ran_v_0;  act_v_ran_v_0.fValue.f_ushort = (unsigned short)1234;
    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_ushort = (unsigned short)+65535;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_ushort = (unsigned short)0;

    const char lex_v_ran_v_1_canrep[]="65535";
    const char lex_v_ran_v_2_canrep[]="0";
    const char lex_v_ran_iv_1_canrep[]="65536";
    const char lex_v_ran_iv_2_canrep[]="-1";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.23.2 Canonical representation
 *
 * The canonical representation for unsignedShort is defined by prohibiting certain options from the
 * Lexical representation (3.3.23.1). Specifically,
 * 1. the leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="    +12345   \n";
    const char data_canrep_1[]="12345";
    const char data_rawstr_2[]="00012345";
    const char data_canrep_2[]="12345";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep,  DONT_CARE);

        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}